

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O1

void json_print_templates(json_session *session,abuf_template_data *data,size_t count)

{
  autobuf *autobuf;
  abuf_template_data *paVar1;
  bool bVar2;
  char *s;
  ulong uVar3;
  long lVar4;
  size_t sVar5;
  
  if (session->empty == true) {
    session->empty = false;
    s = "\n";
  }
  else {
    s = ",\n";
  }
  abuf_puts(session->out,s);
  if (count != 0) {
    autobuf = session->out;
    bVar2 = true;
    sVar5 = 0;
    do {
      if (data[sVar5].count != 0) {
        paVar1 = data + sVar5;
        lVar4 = 0;
        uVar3 = 0;
        do {
          if (*(long *)((long)&paVar1->data->value + lVar4) != 0) {
            if (bVar2) {
              bVar2 = false;
            }
            else {
              abuf_puts(autobuf,",\n");
            }
            abuf_appendf(autobuf,"\"%s\":",*(undefined8 *)((long)&paVar1->data->key + lVar4));
            _json_printvalue(autobuf,*(char **)((long)&paVar1->data->value + lVar4),
                             (&paVar1->data->string)[lVar4]);
          }
          uVar3 = uVar3 + 1;
          lVar4 = lVar4 + 0x18;
        } while (uVar3 < paVar1->count);
      }
      sVar5 = sVar5 + 1;
    } while (sVar5 != count);
  }
  return;
}

Assistant:

void
json_print_templates(struct json_session *session, struct abuf_template_data *data, size_t count) {
  if (session->empty) {
    session->empty = false;
    abuf_puts(session->out, "\n");
  }
  else {
    abuf_puts(session->out, ",\n");
  }

  _add_template(session->out, false, data, count);
}